

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadWriteUnittest.cpp
# Opt level: O2

void __thiscall ReadWriteUnittest::SetUp(ReadWriteUnittest *this)

{
  Serializer *this_00;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  this->iSize = 0xc;
  this->jSize = 0x12;
  this->kSize = 10;
  this->intSize = 4;
  this->doubleSize = 8;
  this->floatSize = 4;
  std::vector<int,_std::allocator<int>_>::resize(&this->fieldInt2,0x78);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->fieldInt3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  std::vector<double,_std::allocator<double>_>::resize(&this->fieldDouble1,(long)this->jSize);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->fieldDouble3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  std::vector<float,_std::allocator<float>_>::resize(&this->fieldFloat1,(long)this->jSize);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->fieldFloat3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->fieldcheckInt2,(long)this->kSize * (long)this->iSize);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->fieldcheckInt3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  std::vector<double,_std::allocator<double>_>::resize(&this->fieldcheckDouble1,(long)this->jSize);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->fieldcheckDouble3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  std::vector<float,_std::allocator<float>_>::resize(&this->fieldcheckFloat1,(long)this->jSize);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->fieldcheckFloat3,(long)this->kSize * (long)this->jSize * (long)this->iSize);
  std::__cxx11::string::string((string *)&local_120,"./",&local_121);
  std::__cxx11::string::string((string *)&local_f8,"ReadWriteUnittest",&local_f9);
  this_00 = &this->ser;
  ser::Serializer::Init(this_00,&local_120,&local_f8,SerializerOpenModeWrite);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"TestSavepoint",(allocator *)&local_f8);
  ser::Savepoint::Init(&this->sp,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"int3",(allocator *)&local_f8);
  std::__cxx11::string::string((string *)&local_38,"int",&local_121);
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_38,this->intSize,this->iSize,this->jSize,this->kSize,1,0,0,0,
             0,0,0,0,0);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"int2",(allocator *)&local_f8);
  std::__cxx11::string::string((string *)&local_58,"int",&local_121);
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_58,this->intSize,this->iSize,1,this->kSize,1,0,0,0,0,0,0,0,0)
  ;
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"double3",(allocator *)&local_f8);
  std::__cxx11::string::string((string *)&local_78,"double",&local_121);
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_78,this->doubleSize,this->iSize,this->jSize,this->kSize,1,0,0
             ,0,0,0,0,0,0);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"double1",(allocator *)&local_f8);
  std::__cxx11::string::string((string *)&local_98,"double",&local_121);
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_98,this->doubleSize,1,this->jSize,1,1,0,0,0,0,0,0,0,0);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"float3",(allocator *)&local_f8);
  std::__cxx11::string::string((string *)&local_b8,"float",&local_121);
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_b8,this->floatSize,this->iSize,this->jSize,this->kSize,1,0,0,
             0,0,0,0,0,0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::string((string *)&local_120,"float1",(allocator *)&local_f8);
  std::__cxx11::string::string((string *)&local_d8,"float",&local_121);
  ser::Serializer::RegisterField
            (this_00,&local_120,&local_d8,this->floatSize,1,this->jSize,1,1,0,0,0,0,0,0,0,0);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_120);
  FillFields(this);
  return;
}

Assistant:

void SetUp() {
        iSize = 12;
        jSize = 18;
        kSize = 10;

        intSize = sizeof(int);
        doubleSize = sizeof(double);
        floatSize = sizeof(float);

        // Allocate fields
        fieldInt2.resize(iSize*kSize);
        fieldInt3.resize(iSize*jSize*kSize);
        fieldDouble1.resize(jSize);
        fieldDouble3.resize(iSize*jSize*kSize);
        fieldFloat1.resize(jSize);
        fieldFloat3.resize(iSize*jSize*kSize);
        fieldcheckInt2.resize(iSize*kSize);
        fieldcheckInt3.resize(iSize*jSize*kSize);
        fieldcheckDouble1.resize(jSize);
        fieldcheckDouble3.resize(iSize*jSize*kSize);
        fieldcheckFloat1.resize(jSize);
        fieldcheckFloat3.resize(iSize*jSize*kSize);

        // Initialize serialization objects
        ser.Init("./", "ReadWriteUnittest", SerializerOpenModeWrite);
        sp.Init("TestSavepoint");

        // Register fields
        ser.RegisterField("int3", "int", intSize, iSize, jSize, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("int2", "int", intSize, iSize, 1, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("double3", "double", doubleSize, iSize, jSize, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("double1", "double", doubleSize, 1, jSize, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("float3", "float", floatSize, iSize, jSize, kSize, 1, 0, 0, 0, 0, 0, 0, 0, 0);
        ser.RegisterField("float1", "float", floatSize, 1, jSize, 1, 1, 0, 0, 0, 0, 0, 0, 0, 0);

        FillFields();
    }